

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5ImagesArrayIndexing.cpp
# Opt level: O3

void __thiscall glcts::GPUShader5ImagesArrayIndexing::initTest(GPUShader5ImagesArrayIndexing *this)

{
  GLint *pGVar1;
  GLint *pGVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  GLuint GVar6;
  undefined4 extraout_var;
  GLuint *pGVar8;
  NotSupportedError *this_00;
  TestError *this_01;
  uint uVar9;
  GPUShader5ImagesArrayIndexing *this_02;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  GLuint index;
  long lVar13;
  char *compute_shader_code_ptr;
  string compute_shader_code;
  GLint max_compute_work_group_invocations_value;
  string local_3a0;
  string local_380;
  string local_360;
  stringstream local_size_y_stringstream;
  undefined1 local_330 [8];
  undefined1 local_328 [368];
  stringstream local_size_x_stringstream;
  undefined1 local_1a8 [112];
  ios_base aiStack_138 [264];
  long lVar7;
  
  if ((this->super_TestCaseBase).m_is_gpu_shader5_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GPU shader5 functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
               ,0x47);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  max_compute_work_group_invocations_value = 0;
  pGVar1 = &this->m_texture_width;
  (**(code **)(lVar7 + 0x860))(0x91bf,0);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Could not query GL_MAX_COMPUTE_WORK_GROUP_SIZE!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0x50);
  pGVar2 = &this->m_texture_height;
  (**(code **)(lVar7 + 0x860))(0x91bf,1);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Could not query GL_MAX_COMPUTE_WORK_GROUP_SIZE!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0x53);
  (**(code **)(lVar7 + 0x868))(0x90eb,&max_compute_work_group_invocations_value);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Could not query GL_MAX_COMPUTE_WORK_GROUP_INVOCATIONS!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0x56);
  if (max_compute_work_group_invocations_value < this->m_texture_width * this->m_texture_height) {
    *pGVar1 = max_compute_work_group_invocations_value / this->m_texture_height;
  }
  compute_shader_code._M_dataplus._M_p = (pointer)&compute_shader_code.field_2;
  compute_shader_code._M_string_length = 0;
  compute_shader_code.field_2._M_local_buf[0] = '\0';
  compute_shader_code_ptr = (char *)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_size_x_stringstream);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_size_y_stringstream);
  std::ostream::operator<<(local_1a8,*pGVar1);
  std::ostream::operator<<(local_330,*pGVar2);
  std::__cxx11::stringbuf::str();
  this_02 = (GPUShader5ImagesArrayIndexing *)local_328;
  std::__cxx11::stringbuf::str();
  getComputeShaderCode(&local_360,this_02,&local_380,&local_3a0);
  std::__cxx11::string::operator=((string *)&compute_shader_code,(string *)&local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  compute_shader_code_ptr = compute_shader_code._M_dataplus._M_p;
  GVar6 = (**(code **)(lVar7 + 0x3c8))();
  this->m_program_id = GVar6;
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glCreateProgram() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0x6b);
  GVar6 = (**(code **)(lVar7 + 0x3f0))(0x91b9);
  this->m_compute_shader_id = GVar6;
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glCreateShader(GL_COMPUTE_SHADER) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0x6f);
  bVar3 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_program_id,this->m_compute_shader_id,1,
                     &compute_shader_code_ptr,(bool *)0x0);
  if (bVar3) {
    pGVar8 = (GLuint *)operator_new__(0x10);
    this->m_to_ids = pGVar8;
    pGVar8[0] = 0;
    pGVar8[1] = 0;
    pGVar8[2] = 0;
    pGVar8[3] = 0;
    (**(code **)(lVar7 + 0x6f8))(4,pGVar8);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"Could not generate texture objects!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                    ,0x7b);
    uVar12 = *pGVar1 * *pGVar2;
    pGVar8 = (GLuint *)operator_new__((ulong)(uVar12 * 4) << 2);
    this->m_data_buffer = pGVar8;
    uVar9 = 0;
    GVar6 = 0;
    do {
      GVar6 = GVar6 + 1;
      uVar10 = (ulong)uVar12;
      uVar11 = uVar9;
      if (uVar12 != 0) {
        do {
          pGVar8[uVar11] = GVar6;
          uVar11 = uVar11 + 1;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      uVar9 = uVar9 + uVar12;
    } while (GVar6 != 4);
    uVar10 = 0;
    lVar13 = 0;
    do {
      (**(code **)(lVar7 + 8))((uint)lVar13 | 0x84c0);
      (**(code **)(lVar7 + 0xb8))(0xde1,this->m_to_ids[lVar13]);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"Could not bind a texture object to texture unit!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                      ,0x8e);
      (**(code **)(lVar7 + 0x1380))(0xde1,1,0x8236,*pGVar1,*pGVar2);
      (**(code **)(lVar7 + 0x13b8))
                (0xde1,0,0,0,this->m_texture_width,this->m_texture_height,0x8d94,0x1405,
                 this->m_data_buffer + uVar10);
      (**(code **)(lVar7 + 0x1350))(0x46180000,0xde1,0x2801);
      (**(code **)(lVar7 + 0x1350))(0x46180000,0xde1,0x2800);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"Could not allocate storage for a texture object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                      ,0x98);
      lVar13 = lVar13 + 1;
      uVar10 = (ulong)((int)uVar10 + uVar12);
    } while (lVar13 != 4);
    if (this->m_data_buffer != (GLuint *)0x0) {
      operator_delete__(this->m_data_buffer);
    }
    this->m_data_buffer = (GLuint *)0x0;
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_size_y_stringstream);
    std::ios_base::~ios_base((ios_base *)(local_328 + 0x68));
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_size_x_stringstream);
    std::ios_base::~ios_base(aiStack_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)compute_shader_code._M_dataplus._M_p != &compute_shader_code.field_2) {
      operator_delete(compute_shader_code._M_dataplus._M_p,
                      CONCAT71(compute_shader_code.field_2._M_allocated_capacity._1_7_,
                               compute_shader_code.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Could not create program object!",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
             ,0x74);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GPUShader5ImagesArrayIndexing::initTest(void)
{
	/* Check if gpu_shader5 extension is supported */
	if (!m_is_gpu_shader5_supported)
	{
		throw tcu::NotSupportedError(GPU_SHADER5_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Calculate platform-specific value that should be used for local_size_x, local_size_y in compute shader */
	glw::GLint max_compute_work_group_invocations_value = 0;

	gl.getIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &m_texture_width);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query GL_MAX_COMPUTE_WORK_GROUP_SIZE!");

	gl.getIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 1, &m_texture_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query GL_MAX_COMPUTE_WORK_GROUP_SIZE!");

	gl.getIntegerv(GL_MAX_COMPUTE_WORK_GROUP_INVOCATIONS, &max_compute_work_group_invocations_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query GL_MAX_COMPUTE_WORK_GROUP_INVOCATIONS!");

	if (m_texture_width * m_texture_height > max_compute_work_group_invocations_value)
	{
		m_texture_width = (max_compute_work_group_invocations_value / m_texture_height);
	}

	/* Construct compute shader code */
	std::string		  compute_shader_code;
	const char*		  compute_shader_code_ptr = DE_NULL;
	std::stringstream local_size_x_stringstream;
	std::stringstream local_size_y_stringstream;

	local_size_x_stringstream << m_texture_width;
	local_size_y_stringstream << m_texture_height;

	compute_shader_code		= getComputeShaderCode(local_size_x_stringstream.str(), local_size_y_stringstream.str());
	compute_shader_code_ptr = (const char*)compute_shader_code.c_str();

	/* Create a program object */
	m_program_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed");

	/* Create a compute shader object */
	m_compute_shader_id = gl.createShader(GL_COMPUTE_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader(GL_COMPUTE_SHADER) failed");

	/* Build a program object that consists only of the compute shader */
	if (!buildProgram(m_program_id, m_compute_shader_id, 1, &compute_shader_code_ptr))
	{
		TCU_FAIL("Could not create program object!");
	}

	/* Generate texture objects */
	m_to_ids = new glw::GLuint[m_array_size];
	memset(m_to_ids, 0, m_array_size * sizeof(glw::GLuint));
	gl.genTextures(m_array_size, m_to_ids);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate texture objects!");

	/* Allocate a buffer we will later fill with data and use as a data source for a texture object */
	glw::GLuint dataSize = m_texture_width * m_texture_height * m_texture_n_components;
	m_data_buffer		 = new glw::GLuint[dataSize * m_array_size];

	for (glw::GLuint array_index = 0; array_index < m_array_size; ++array_index)
	{
		for (glw::GLuint index = 0; index < dataSize; ++index)
		{
			m_data_buffer[index + array_index * dataSize] = 1 + array_index;
		}
	}

	/* Initialize storage for the texture objects */
	for (glw::GLuint index = 0; index < m_array_size; index++)
	{
		gl.activeTexture(GL_TEXTURE0 + index);
		gl.bindTexture(GL_TEXTURE_2D, m_to_ids[index]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind a texture object to texture unit!");

		gl.texStorage2D(GL_TEXTURE_2D, 1 /* levels */, GL_R32UI, m_texture_width, m_texture_height);

		gl.texSubImage2D(GL_TEXTURE_2D, 0 /* level */, 0 /* x offset */, 0 /* y offset */, m_texture_width,
						 m_texture_height, GL_RED_INTEGER, GL_UNSIGNED_INT, &m_data_buffer[index * dataSize]);

		gl.texParameterf(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameterf(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not allocate storage for a texture object!");
	}

	delete[] m_data_buffer;
	m_data_buffer = DE_NULL;
}